

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

ssize_t __thiscall Process::Arguments::read(Arguments *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  String *extraout_RAX;
  String *pSVar7;
  String *extraout_RAX_00;
  usize uVar8;
  String *extraout_RAX_01;
  String *extraout_RAX_02;
  Option *pOVar9;
  undefined4 in_register_00000034;
  int *piVar10;
  char *s;
  usize uVar11;
  usize uVar12;
  
  piVar10 = (int *)CONCAT44(in_register_00000034,__fd);
  bVar2 = nextChar(this);
  if (!bVar2) {
    return 0;
  }
  bVar3 = this->inOpt;
  if ((((bool)bVar3 == false) && (this->skipOpt == false)) && (pcVar6 = this->arg, *pcVar6 == '-'))
  {
    if (pcVar6[1] != '-') {
      this->arg = pcVar6 + 1;
      if (pcVar6[1] == '\0') {
        *piVar10 = 0;
        String::attach((String *)__buf,pcVar6,1);
        pSVar7 = extraout_RAX_00;
        goto LAB_00104061;
      }
      this->inOpt = true;
      goto LAB_00103eeb;
    }
    this->arg = pcVar6 + 2;
    if (pcVar6[2] == '\0') {
      this->skipOpt = true;
      bVar2 = nextChar(this);
      if (!bVar2) {
        return 0;
      }
      bVar3 = this->inOpt;
      goto LAB_00103ee7;
    }
    pcVar6 = String::find(pcVar6 + 2,'=');
    if (pcVar6 == (char *)0x0) {
      uVar11 = String::length(this->arg);
    }
    else {
      uVar11 = (long)pcVar6 - (long)this->arg;
    }
    for (pOVar9 = this->options; pOVar9 < this->optionsEnd; pOVar9 = pOVar9 + 1) {
      if (((pOVar9->name != (char *)0x0) &&
          (iVar4 = String::compare(pOVar9->name,this->arg,uVar11), iVar4 == 0)) &&
         (pOVar9->name[uVar11] == '\0')) {
        pcVar1 = this->arg;
        s = pcVar1 + ((uVar11 + 1) - (ulong)(pcVar6 == (char *)0x0));
        *piVar10 = pOVar9->character;
        this->arg = s;
        uVar5 = pOVar9->flags;
        if ((uVar5 & 1) == 0) goto LAB_00104059;
        if (pcVar6 != (char *)0x0) goto LAB_00103f23;
        if ((uVar5 & 2) == 0) {
          bVar2 = nextChar(this);
          if (bVar2) goto LAB_00103f1f;
          uVar5 = pOVar9->flags;
        }
        if ((uVar5 & 2) != 0) goto LAB_00104059;
        String::attach((String *)__buf,pcVar1 + -2,uVar11 + 2);
        pSVar7 = extraout_RAX_02;
        goto LAB_00103fad;
      }
    }
    *piVar10 = 0x3f;
    uVar8 = String::length(this->arg + uVar11);
    uVar12 = uVar8 + uVar11;
    pcVar6 = this->arg + -2;
    uVar11 = uVar8 + uVar11 + 2;
  }
  else {
LAB_00103ee7:
    if ((bVar3 & 1) != 0) {
LAB_00103eeb:
      pcVar6 = this->arg;
      s = pcVar6 + 1;
      this->arg = s;
      iVar4 = (int)*pcVar6;
      *piVar10 = iVar4;
      for (pOVar9 = this->options; pOVar9 < this->optionsEnd; pOVar9 = pOVar9 + 1) {
        if (pOVar9->character == iVar4) {
          if ((pOVar9->flags & 3) != 1) goto LAB_00104059;
          if (*s != '\0') goto LAB_00103f23;
          bVar2 = nextChar(this);
          if (!bVar2) {
            String::clear((String *)__buf);
            String::append((String *)__buf,'-');
            pSVar7 = String::append((String *)__buf,(char)*piVar10);
LAB_00103fad:
            *piVar10 = 0x3a;
            goto LAB_00104061;
          }
          goto LAB_00103f1f;
        }
      }
      String::clear((String *)__buf);
      String::append((String *)__buf,'-');
      pSVar7 = String::append((String *)__buf,(char)*piVar10);
      *piVar10 = 0x3f;
      goto LAB_00104061;
    }
    *piVar10 = 0;
LAB_00103f1f:
    s = this->arg;
LAB_00103f23:
    uVar11 = String::length(s);
    pcVar6 = this->arg;
    uVar12 = uVar11;
  }
  String::attach((String *)__buf,pcVar6,uVar11);
  this->arg = this->arg + uVar12;
  pSVar7 = extraout_RAX;
LAB_00104061:
  return CONCAT71((int7)((ulong)pSVar7 >> 8),1);
LAB_00104059:
  String::clear((String *)__buf);
  pSVar7 = extraout_RAX_01;
  goto LAB_00104061;
}

Assistant:

bool Process::Arguments::read(int& character, String& argument)
{
  if(!nextChar())
    return false;

  if(!inOpt && !skipOpt)
  {
    if(*arg == '-')
    {
      if(arg[1] == '-')
      { // handel '--' arg
        arg += 2;
        if(!*arg)
        {
          skipOpt = true;
          if(!nextChar())
            return false;
        }
        else
        {
          const char* end = String::find(arg, '=');
          usize argLen = end ? end - arg : String::length(arg);
          for(const Option* opt = options; opt < optionsEnd; ++opt)
            if(opt->name && String::compare(opt->name, arg, argLen) == 0 && !opt->name[argLen])
            {
              const char* argName = arg;
              character = opt->character;
              arg += end ? argLen + 1 : argLen;
              if(opt->flags & Process::argumentFlag)
              {
                if(end || (!(opt->flags & Process::optionalFlag) && nextChar()))
                {
                  usize len = String::length(arg);
                  argument.attach(arg, len);
                  arg += len;
                  return true;
                }
                if(!(opt->flags & Process::optionalFlag))
                {
                  // missing argument
                  argument.attach(argName - 2, argLen + 2);
                  character = ':';
                  return true;
                }
              }
              argument.clear();
              return true;
            }

          // unknown option
          character = '?';
          argLen += String::length(arg + argLen);
          argument.attach(arg - 2, argLen + 2);
          arg += argLen;
          return true;
        }
      }
      else
      {
        if(!*(++arg))
        {
          character = 0;
          argument.attach(arg - 1, 1); // "-"
          return true;
        }
        inOpt = true;
      }
    }
  }

  // find option *str
  if(inOpt)
  {
    character = *(arg++);
    for(const Option* opt = options; opt < optionsEnd; ++opt)
      if(opt->character == character)
      {
        if(opt->flags & Process::argumentFlag && !(opt->flags & Process::optionalFlag))
        {
          if(!*arg)
          {
            if(!nextChar())
            { // missing argument
              argument.clear();
              argument.append('-');
              argument.append((char)character);
              character = ':';
              return true;
            }
          }
          usize len = String::length(arg);
          argument.attach(arg, len);
          arg += len;
          return true;
        }
        argument.clear();
        return true;
      }

    // unknown option
    argument.clear();
    argument.append('-');
    argument.append((char)character);
    character = '?';
    return true;
  }

  // non option argument
  character = '\0';
  usize len = String::length(arg);
  argument.attach(arg, len);
  arg += len;
  return true;
}